

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O0

field_type test::get_field_type(string *field)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if ((((((!bVar1) && (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)) &&
        (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)) &&
       ((bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1 &&
        (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)))) &&
      ((bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1 &&
       ((bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1 &&
        (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)))))) &&
     ((bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1 &&
      ((((bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1 &&
         (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)) &&
        (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)) &&
       (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)))))) {
    bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
    if ((((!bVar1) && (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)) &&
        ((bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1 &&
         ((bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1 &&
          (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)))))) &&
       (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)) {
      bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
      if ((!bVar1) && (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)) {
        return STRING;
      }
      return FLOAT;
    }
    return BOOL;
  }
  return INT;
}

Assistant:

static field_type get_field_type(const std::string & field) {
        if (field == "build_number" || field == "n_batch" || field == "n_ubatch" || field == "n_threads" ||
            field == "poll" || field == "model_size" || field == "model_n_params" || field == "n_gpu_layers" ||
            field == "main_gpu" || field == "n_prompt" || field == "n_gen" || field == "avg_ns" ||
            field == "stddev_ns") {
            return INT;
        }
        if (field == "f16_kv" || field == "no_kv_offload" || field == "cpu_strict" || field == "flash_attn" ||
            field == "use_mmap" || field == "embeddings") {
            return BOOL;
        }
        if (field == "avg_ts" || field == "stddev_ts") {
            return FLOAT;
        }
        return STRING;
    }